

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timer.c
# Opt level: O3

int run_test_timer_run_once(void)

{
  int iVar1;
  int extraout_EAX;
  undefined8 uVar2;
  uv_timer_t timer_handle;
  undefined1 local_a0 [152];
  
  uVar2 = uv_default_loop();
  iVar1 = uv_timer_init(uVar2,local_a0);
  if (iVar1 == 0) {
    iVar1 = uv_timer_start(local_a0,timer_run_once_timer_cb,0,0);
    if (iVar1 != 0) goto LAB_00177a1d;
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,1);
    if (iVar1 != 0) goto LAB_00177a22;
    if (timer_run_once_timer_cb_called != 1) goto LAB_00177a27;
    iVar1 = uv_timer_start(local_a0,timer_run_once_timer_cb,1,0);
    if (iVar1 != 0) goto LAB_00177a2c;
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,1);
    if (iVar1 != 0) goto LAB_00177a31;
    if (timer_run_once_timer_cb_called != 2) goto LAB_00177a36;
    uv_close(local_a0,0);
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,1);
    if (iVar1 == 0) {
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_00177a40;
    }
  }
  else {
    run_test_timer_run_once_cold_1();
LAB_00177a1d:
    run_test_timer_run_once_cold_2();
LAB_00177a22:
    run_test_timer_run_once_cold_3();
LAB_00177a27:
    run_test_timer_run_once_cold_4();
LAB_00177a2c:
    run_test_timer_run_once_cold_5();
LAB_00177a31:
    run_test_timer_run_once_cold_6();
LAB_00177a36:
    run_test_timer_run_once_cold_7();
  }
  run_test_timer_run_once_cold_8();
LAB_00177a40:
  run_test_timer_run_once_cold_9();
  timer_run_once_timer_cb_called = timer_run_once_timer_cb_called + 1;
  return extraout_EAX;
}

Assistant:

TEST_IMPL(timer_run_once) {
  uv_timer_t timer_handle;

  ASSERT(0 == uv_timer_init(uv_default_loop(), &timer_handle));
  ASSERT(0 == uv_timer_start(&timer_handle, timer_run_once_timer_cb, 0, 0));
  ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_ONCE));
  ASSERT(1 == timer_run_once_timer_cb_called);

  ASSERT(0 == uv_timer_start(&timer_handle, timer_run_once_timer_cb, 1, 0));
  ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_ONCE));
  ASSERT(2 == timer_run_once_timer_cb_called);

  uv_close((uv_handle_t*) &timer_handle, NULL);
  ASSERT(0 == uv_run(uv_default_loop(), UV_RUN_ONCE));

  MAKE_VALGRIND_HAPPY();
  return 0;
}